

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  cmGeneratorTarget *pcVar1;
  pointer pbVar2;
  ulong __val;
  undefined8 uVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  PolicyStatus PVar8;
  uint uVar9;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar10;
  cmState *pcVar11;
  string *psVar12;
  char *pcVar13;
  string *psVar14;
  mapped_type *pmVar15;
  char *pcVar16;
  ulong uVar17;
  string *cfg_1;
  cmQtAutoGenInitializer *pcVar18;
  pointer pbVar19;
  char cVar20;
  string *cfg;
  unsigned_long iVerb;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraDeps;
  cmTarget *depTarget;
  undefined1 local_a8 [32];
  undefined1 local_88 [40];
  string *local_60;
  cmMakefile *local_58;
  cmQtAutoGenInitializer *local_50;
  string *local_48;
  cmTarget *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  this_00 = cmTarget::GetMakefile(this->Target->Target);
  pcVar10 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  iVar7 = (*pcVar10->GlobalGenerator->_vptr_cmGlobalGenerator[0x23])();
  this->MultiConfig = SUB41(iVar7,0);
  local_58 = this_00;
  cmMakefile::GetConfigurations((string *)local_a8,this_00,&this->ConfigsList,true);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)local_a8);
  if ((SystemInformationImplementation *)local_a8._0_8_ !=
      (SystemInformationImplementation *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((this->ConfigsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ConfigsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ConfigsList,&this->ConfigDefault);
  }
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CMAKE_AUTOGEN_VERBOSE","");
  cmMakefile::GetSafeDefinition(local_58,(string *)local_a8);
  psVar12 = &this->Verbosity;
  std::__cxx11::string::_M_assign((string *)psVar12);
  if ((SystemInformationImplementation *)local_a8._0_8_ !=
      (SystemInformationImplementation *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((this->Verbosity)._M_string_length != 0) {
    local_a8._0_8_ = (SystemInformationImplementation *)0x0;
    bVar5 = cmSystemTools::StringToULong((psVar12->_M_dataplus)._M_p,(unsigned_long *)local_a8);
    if (!bVar5) {
      bVar5 = cmSystemTools::IsOn(psVar12);
      pcVar16 = "0";
      if (bVar5) {
        pcVar16 = "1";
      }
      std::__cxx11::string::_M_replace
                ((ulong)psVar12,0,(char *)(this->Verbosity)._M_string_length,(ulong)pcVar16);
    }
  }
  pcVar11 = cmMakefile::GetState(local_58);
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"AUTOMOC_TARGETS_FOLDER","");
  pcVar16 = cmState::GetGlobalProperty(pcVar11,(string *)local_a8);
  if ((SystemInformationImplementation *)local_a8._0_8_ !=
      (SystemInformationImplementation *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if (pcVar16 == (char *)0x0) {
    pcVar11 = cmMakefile::GetState(local_58);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"AUTOGEN_TARGETS_FOLDER","");
    pcVar16 = cmState::GetGlobalProperty(pcVar11,(string *)local_a8);
    if ((SystemInformationImplementation *)local_a8._0_8_ !=
        (SystemInformationImplementation *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if (pcVar16 == (char *)0x0) {
      pcVar1 = this->Target;
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"FOLDER","");
      pcVar16 = cmGeneratorTarget::GetProperty(pcVar1,(string *)local_a8);
      if ((SystemInformationImplementation *)local_a8._0_8_ !=
          (SystemInformationImplementation *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      if (pcVar16 == (char *)0x0) goto LAB_001e3f37;
    }
  }
  pcVar13 = (char *)(this->TargetsFolder)._M_string_length;
  strlen(pcVar16);
  std::__cxx11::string::_M_replace((ulong)&this->TargetsFolder,0,pcVar13,(ulong)pcVar16);
LAB_001e3f37:
  PVar8 = cmMakefile::GetPolicyStatus(local_58,CMP0071,false);
  if (PVar8 - NEW < 3) {
    this->CMP0071Accept = true;
  }
  else if (PVar8 == WARN) {
    this->CMP0071Warn = true;
  }
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = (string *)0x0;
  local_88._16_8_ = local_88._16_8_ & 0xffffffffffffff00;
  psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_58);
  cmsys::SystemTools::CollapseFullPath((string *)local_a8,(string *)local_88,psVar12);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  local_60 = &(this->Dir).Info;
  std::__cxx11::string::_M_assign((string *)local_60);
  std::__cxx11::string::append((char *)local_60);
  std::__cxx11::string::push_back((char)local_60);
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::_M_append((char *)local_60,(ulong)(psVar12->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)local_60);
  std::__cxx11::string::append((char *)local_60);
  cmsys::SystemTools::ConvertToUnixSlashes(local_60);
  pcVar1 = this->Target;
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"AUTOGEN_BUILD_DIR","");
  pcVar13 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)local_88);
  psVar12 = &(this->Dir).Build;
  pcVar16 = (char *)(this->Dir).Build._M_string_length;
  strlen(pcVar13);
  std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar16,(ulong)pcVar13);
  if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if ((this->Dir).Build._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)psVar12);
    std::__cxx11::string::push_back((char)psVar12);
    psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_append((char *)psVar12,(ulong)(psVar14->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)psVar12);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(psVar12);
  AddCleanFile(this,psVar12);
  psVar12 = &(this->Dir).Work;
  std::__cxx11::string::_M_assign((string *)psVar12);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar12);
  psVar12 = &(this->Dir).Include;
  std::__cxx11::string::_M_assign((string *)psVar12);
  std::__cxx11::string::append((char *)psVar12);
  bVar6 = this->MultiConfig;
  local_48 = psVar12;
  if ((bool)bVar6 == true) {
    std::__cxx11::string::append((char *)psVar12);
    bVar6 = this->MultiConfig;
  }
  local_50 = this;
  if ((bVar6 & 1) != 0) {
    pbVar19 = (this->ConfigsList).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar19 != pbVar2) {
      do {
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(this->Dir).ConfigInclude,pbVar19);
        std::__cxx11::string::_M_assign((string *)pmVar15);
        std::__cxx11::string::append((char *)pmVar15);
        std::__cxx11::string::_M_append((char *)pmVar15,(ulong)(pbVar19->_M_dataplus)._M_p);
        pbVar19 = pbVar19 + 1;
      } while (pbVar19 != pbVar2);
    }
  }
  if ((SystemInformationImplementation *)local_a8._0_8_ !=
      (SystemInformationImplementation *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar18 = local_50;
  bVar5 = (local_50->Moc).super_GenVarsT.Enabled;
  bVar6 = (local_50->Uic).super_GenVarsT.Enabled;
  if (((bVar5 | bVar6) & 1) != 0) {
    if (bVar5 != false) {
      bVar5 = InitMoc(local_50);
      if (!bVar5) {
        return false;
      }
      bVar6 = (pcVar18->Uic).super_GenVarsT.Enabled;
    }
    if (((bVar6 & 1) != 0) && (bVar5 = InitUic(pcVar18), !bVar5)) {
      return false;
    }
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar18->Target);
    std::__cxx11::string::_M_assign((string *)&pcVar18->AutogenTarget);
    std::__cxx11::string::append((char *)&pcVar18->AutogenTarget);
    pcVar1 = pcVar18->Target;
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"AUTOGEN_PARALLEL","");
    pcVar13 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)local_a8);
    psVar12 = &(pcVar18->AutogenTarget).Parallel;
    pcVar16 = (char *)(pcVar18->AutogenTarget).Parallel._M_string_length;
    strlen(pcVar13);
    std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar16,(ulong)pcVar13);
    if ((SystemInformationImplementation *)local_a8._0_8_ !=
        (SystemInformationImplementation *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if (((pcVar18->AutogenTarget).Parallel._M_string_length == 0) ||
       (iVar7 = std::__cxx11::string::compare((char *)psVar12), iVar7 == 0)) {
      if (GetParallelCPUCount()::count == 0) {
        cmsys::SystemInformation::SystemInformation((SystemInformation *)local_a8);
        cmsys::SystemInformation::RunCPUCheck((SystemInformation *)local_a8);
        uVar9 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)local_a8);
        uVar9 = uVar9 + (uVar9 == 0);
        if (0x40 < uVar9) {
          uVar9 = 0x40;
        }
        GetParallelCPUCount()::count = (ulong)uVar9;
        cmsys::SystemInformation::~SystemInformation((SystemInformation *)local_a8);
      }
      __val = GetParallelCPUCount()::count;
      cVar20 = '\x01';
      if (9 < GetParallelCPUCount()::count) {
        uVar17 = GetParallelCPUCount()::count;
        cVar4 = '\x04';
        do {
          cVar20 = cVar4;
          if (uVar17 < 100) {
            cVar20 = cVar20 + -2;
            goto LAB_001e43a5;
          }
          if (uVar17 < 1000) {
            cVar20 = cVar20 + -1;
            goto LAB_001e43a5;
          }
          if (uVar17 < 10000) goto LAB_001e43a5;
          bVar5 = 99999 < uVar17;
          uVar17 = uVar17 / 10000;
          cVar4 = cVar20 + '\x04';
        } while (bVar5);
        cVar20 = cVar20 + '\x01';
      }
LAB_001e43a5:
      local_a8._0_8_ = (SystemInformationImplementation *)(local_a8 + 0x10);
      std::__cxx11::string::_M_construct((ulong)local_a8,cVar20);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8._0_8_,local_a8._8_4_,__val);
      std::__cxx11::string::operator=((string *)psVar12,(string *)local_a8);
      pcVar18 = local_50;
      if ((SystemInformationImplementation *)local_a8._0_8_ !=
          (SystemInformationImplementation *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        pcVar18 = local_50;
      }
    }
    psVar12 = &(pcVar18->AutogenTarget).InfoFile;
    std::__cxx11::string::_M_assign((string *)psVar12);
    std::__cxx11::string::append((char *)psVar12);
    psVar12 = &(pcVar18->AutogenTarget).SettingsFile;
    std::__cxx11::string::_M_assign((string *)psVar12);
    std::__cxx11::string::append((char *)psVar12);
    if (pcVar18->MultiConfig == true) {
      pbVar19 = (pcVar18->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pcVar18->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar19 != pbVar2) {
        local_38 = &(local_50->AutogenTarget).ConfigSettingsFile;
        do {
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](local_38,pbVar19);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,"_",pbVar19);
          cmQtAutoGen::AppendFilenameSuffix
                    ((string *)local_a8,psVar12,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
          std::__cxx11::string::operator=((string *)pmVar15,(string *)local_a8);
          if ((SystemInformationImplementation *)local_a8._0_8_ !=
              (SystemInformationImplementation *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
            operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
          }
          AddCleanFile(local_50,pmVar15);
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar2);
      }
    }
    else {
      AddCleanFile(pcVar18,psVar12);
    }
    pcVar18 = local_50;
    psVar12 = &(local_50->AutogenTarget).ParseCacheFile;
    std::__cxx11::string::_M_assign((string *)psVar12);
    std::__cxx11::string::append((char *)psVar12);
    AddCleanFile(pcVar18,psVar12);
    pcVar1 = pcVar18->Target;
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"AUTOGEN_ORIGIN_DEPENDS","");
    bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,(string *)local_a8);
    (pcVar18->AutogenTarget).DependOrigin = bVar5;
    if ((SystemInformationImplementation *)local_a8._0_8_ !=
        (SystemInformationImplementation *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    pcVar1 = pcVar18->Target;
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"AUTOGEN_TARGET_DEPENDS","");
    pcVar16 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,pcVar16,(allocator<char> *)&local_40);
    if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (CONCAT44(local_a8._12_4_,local_a8._8_4_) != 0) {
      local_88._0_8_ = (string *)0x0;
      local_88._8_8_ = (string *)0x0;
      local_88._16_8_ = 0;
      cmSystemTools::ExpandListArgument
                ((string *)local_a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88,false);
      uVar3 = local_88._8_8_;
      if (local_88._0_8_ != local_88._8_8_) {
        psVar12 = (string *)local_88._0_8_;
        do {
          local_40 = cmMakefile::FindTargetToUse(local_58,psVar12,false);
          if (local_40 == (cmTarget *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(pcVar18->AutogenTarget).DependFiles,psVar12);
          }
          else {
            std::
            _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
            ::_M_insert_unique<cmTarget*const&>
                      ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                        *)&(pcVar18->AutogenTarget).DependTargets,&local_40);
          }
          psVar12 = psVar12 + 1;
        } while (psVar12 != (string *)uVar3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
    }
    if ((SystemInformationImplementation *)local_a8._0_8_ !=
        (SystemInformationImplementation *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if ((pcVar18->Moc).super_GenVarsT.Enabled == true) {
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"CMAKE_AUTOMOC_RELAXED_MODE","");
      pcVar16 = cmMakefile::GetDefinition(local_58,(string *)local_a8);
      bVar5 = cmSystemTools::IsOn(pcVar16);
      if ((SystemInformationImplementation *)local_a8._0_8_ !=
          (SystemInformationImplementation *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      if (bVar5) {
        local_a8._0_8_ = local_a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,
                   "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  "
                   ,"");
        std::__cxx11::string::append(local_a8);
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar18->Target);
        std::__cxx11::string::_M_append(local_a8,(ulong)(psVar12->_M_dataplus)._M_p);
        std::__cxx11::string::append(local_a8);
        cmMakefile::IssueMessage(local_58,AUTHOR_WARNING,(string *)local_a8);
        if ((SystemInformationImplementation *)local_a8._0_8_ !=
            (SystemInformationImplementation *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
      }
    }
  }
  if (((pcVar18->Rcc).super_GenVarsT.Enabled != true) || (bVar5 = InitRcc(pcVar18), bVar5)) {
    if ((((pcVar18->Moc).super_GenVarsT.Enabled != false) ||
        (((pcVar18->Uic).super_GenVarsT.Enabled & 1U) != 0)) ||
       (((pcVar18->Rcc).super_GenVarsT.Enabled == true && (pcVar18->MultiConfig == true)))) {
      cmGeneratorTarget::AddIncludeDirectory(pcVar18->Target,local_48,true);
    }
    bVar5 = InitScanFiles(pcVar18);
    if (bVar5) {
      if (((pcVar18->Moc).super_GenVarsT.Enabled != false) ||
         (((pcVar18->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        InitAutogenTarget(pcVar18);
      }
      if ((pcVar18->Rcc).super_GenVarsT.Enabled == true) {
        InitRccTargets(pcVar18);
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
  cmGlobalGenerator* globalGen = localGen->GetGlobalGenerator();

  // Configurations
  this->MultiConfig = globalGen->IsMultiConfig();
  this->ConfigDefault = makefile->GetConfigurations(this->ConfigsList);
  if (this->ConfigsList.empty()) {
    this->ConfigsList.push_back(this->ConfigDefault);
  }

  // Verbosity
  this->Verbosity = makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
  if (!this->Verbosity.empty()) {
    unsigned long iVerb = 0;
    if (!cmSystemTools::StringToULong(this->Verbosity.c_str(), &iVerb)) {
      // Non numeric verbosity
      this->Verbosity = cmSystemTools::IsOn(this->Verbosity) ? "1" : "0";
    }
  }

  // Targets FOLDER
  {
    const char* folder =
      makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (folder == nullptr) {
      folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (folder == nullptr) {
      folder = this->Target->GetProperty("FOLDER");
    }
    if (folder != nullptr) {
      this->TargetsFolder = folder;
    }
  }

  // Check status of policy CMP0071
  {
    cmPolicies::PolicyStatus const CMP0071_status =
      makefile->GetPolicyStatus(cmPolicies::CMP0071);
    switch (CMP0071_status) {
      case cmPolicies::WARN:
        this->CMP0071Warn = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // Ignore GENERATED file
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Process GENERATED file
        this->CMP0071Accept = true;
        break;
    }
  }

  // Common directories
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cbd;
    this->Dir.Info += "/CMakeFiles";
    this->Dir.Info += '/';
    this->Dir.Info += this->Target->GetName();
    this->Dir.Info += "_autogen";
    this->Dir.Info += ".dir";
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->Target->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build = cbd;
      this->Dir.Build += '/';
      this->Dir.Build += this->Target->GetName();
      this->Dir.Build += "_autogen";
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->Dir.Include = this->Dir.Build;
    this->Dir.Include += "/include";
    if (this->MultiConfig) {
      this->Dir.Include += "_$<CONFIG>";
    }
    // Per config include directories
    if (this->MultiConfig) {
      for (std::string const& cfg : this->ConfigsList) {
        std::string& dir = this->Dir.ConfigInclude[cfg];
        dir = this->Dir.Build;
        dir += "/include_";
        dir += cfg;
      }
    }
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name = this->Target->GetName();
    this->AutogenTarget.Name += "_autogen";

    // Autogen target parallel processing
    this->AutogenTarget.Parallel =
      this->Target->GetSafeProperty("AUTOGEN_PARALLEL");
    if (this->AutogenTarget.Parallel.empty() ||
        (this->AutogenTarget.Parallel == "AUTO")) {
      // Autodetect number of CPUs
      this->AutogenTarget.Parallel = std::to_string(GetParallelCPUCount());
    }

    // Autogen target info and settings files
    {
      this->AutogenTarget.InfoFile = this->Dir.Info;
      this->AutogenTarget.InfoFile += "/AutogenInfo.cmake";

      this->AutogenTarget.SettingsFile = this->Dir.Info;
      this->AutogenTarget.SettingsFile += "/AutogenOldSettings.txt";

      if (this->MultiConfig) {
        for (std::string const& cfg : this->ConfigsList) {
          std::string& filename = this->AutogenTarget.ConfigSettingsFile[cfg];
          filename =
            AppendFilenameSuffix(this->AutogenTarget.SettingsFile, "_" + cfg);
          this->AddCleanFile(filename);
        }
      } else {
        this->AddCleanFile(this->AutogenTarget.SettingsFile);
      }

      this->AutogenTarget.ParseCacheFile = this->Dir.Info;
      this->AutogenTarget.ParseCacheFile += "/ParseCache.txt";
      this->AddCleanFile(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->Target->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const deps =
        this->Target->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        std::vector<std::string> extraDeps;
        cmSystemTools::ExpandListArgument(deps, extraDeps);
        for (std::string const& depName : extraDeps) {
          // Allow target and file dependencies
          auto* depTarget = makefile->FindTargetToUse(depName);
          if (depTarget != nullptr) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    // CMAKE_AUTOMOC_RELAXED_MODE deprecation warning
    if (this->Moc.Enabled) {
      if (cmSystemTools::IsOn(
            makefile->GetDefinition("CMAKE_AUTOMOC_RELAXED_MODE"))) {
        std::string msg = "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                          "deprecated an will be removed in the future.  ";
        msg += "Consider disabling it and converting the target ";
        msg += this->Target->GetName();
        msg += " to regular mode.";
        makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    this->Target->AddIncludeDirectory(this->Dir.Include, true);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}